

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O2

int Saig_BmcPerform(Aig_Man_t *pAig,int nStart,int nFramesMax,int nNodesMax,int nTimeOut,
                   int nConfMaxOne,int nConfMaxAll,int fVerbose,int fVerbOverwrite,int *piFrames,
                   int fSilent,int fUseSatoko)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  abctime aVar10;
  Saig_Bmc_t *p;
  Aig_Man_t *pAig_00;
  Cnf_Dat_t *p_00;
  char *pcVar11;
  ulong uVar12;
  Saig_Bmc_t *pSVar13;
  FILE *pFVar14;
  uint local_5c;
  abctime local_58;
  int nOutsSolved;
  uint local_48;
  int local_44;
  abctime local_40;
  abctime local_38;
  
  nOutsSolved = 0;
  local_44 = nStart;
  if (nTimeOut == 0) {
    local_58 = 0;
  }
  else {
    aVar10 = Abc_Clock();
    local_58 = aVar10 + (long)nTimeOut * 1000000;
  }
  local_40 = Abc_Clock();
  local_38 = Abc_Clock();
  if (fVerbose != 0) {
    uVar1 = pAig->nRegs;
    uVar2 = pAig->nTruePis;
    uVar3 = pAig->nTruePos;
    iVar9 = pAig->nObjs[6];
    iVar6 = pAig->nObjs[5];
    local_48 = nNodesMax;
    uVar5 = Aig_ManLevelNum(pAig);
    nNodesMax = local_48;
    printf("Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar2,
           (ulong)uVar3,(ulong)uVar1,(ulong)(uint)(iVar9 + iVar6),(ulong)uVar5);
    printf("Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n",
           (ulong)(uint)nFramesMax,(ulong)(uint)nNodesMax,(ulong)(uint)nConfMaxOne,
           (ulong)(uint)nConfMaxAll);
  }
  iVar9 = 1000000000;
  if (nFramesMax != 0) {
    iVar9 = nFramesMax;
  }
  p = Saig_BmcManStart(pAig,iVar9,nNodesMax,nConfMaxOne,nConfMaxAll,fVerbose,fUseSatoko);
  if (nTimeOut != 0) {
    if (p->pSat2 == (satoko_t *)0x0) {
      p->pSat->nRuntimeLimit = local_58;
    }
    else {
      satoko_set_runtime_limit(p->pSat2,local_58);
    }
  }
  local_5c = 0;
  while( true ) {
    Abc_Clock();
    pSVar13 = p;
    Saig_BmcInterval(p);
    iVar9 = (int)pSVar13;
    if (p->vTargets->nSize == 0) break;
    pAig_00 = Saig_BmcIntervalToAig(p);
    p_00 = Cnf_Derive(pAig_00,pAig_00->nObjs[3]);
    Cnf_DataLift(p_00,p->nSatVars);
    p->nSatVars = p->nSatVars + p_00->nVars;
    Saig_BmcLoadCnf(p,p_00);
    Cnf_DataFree(p_00);
    Aig_ManStop(pAig_00);
    pSVar13 = p;
    iVar6 = Saig_BmcSolveTargets(p,local_44,&nOutsSolved);
    iVar9 = (int)pSVar13;
    if (fVerbose != 0) {
      uVar1 = p->iFrameLast;
      uVar2 = p->iOutputLast;
      iVar9 = p->pFrm->nObjs[6];
      iVar8 = p->pFrm->nObjs[5];
      uVar3 = p->nSatVars;
      if (p->pSat == (sat_solver *)0x0) {
        iVar7 = satoko_conflictnum(p->pSat2);
      }
      else {
        iVar7 = (int)(p->pSat->stats).conflicts;
      }
      printf("%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ",(ulong)local_5c,(ulong)uVar1,
             (ulong)uVar2,(ulong)(uint)(iVar9 + iVar8),(ulong)uVar3,iVar7);
      printf("%4.0f MB",(double)p->nObjs * (double)(p->iFrameLast + 1) * 4.0 * 9.5367431640625e-07);
      aVar10 = Abc_Clock();
      printf("%9.2f sec",(double)((float)(aVar10 - local_38) / 1e+06));
      putchar(10);
      pFVar14 = _stdout;
      fflush(_stdout);
      iVar9 = (int)pFVar14;
    }
    if (iVar6 != -1) {
      if (iVar6 == 1) {
        if (p->pAig->nTruePos * p->iFrameFail + p->iOutputFail + 1 != nOutsSolved) {
          __assert_fail("p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                        ,0x37a,
                        "int Saig_BmcPerform(Aig_Man_t *, int, int, int, int, int, int, int, int, int *, int, int)"
                       );
        }
        if (fSilent == 0) {
          Abc_Print(iVar9,"Output %d of miter \"%s\" was asserted in frame %d. ",
                    (ulong)(uint)p->iOutputFail,p->pAig->pName);
        }
        if (piFrames == (int *)0x0) {
          iVar6 = 0;
          bVar4 = true;
          goto LAB_00473683;
        }
        iVar8 = p->iFrameFail + -1;
        iVar6 = 0;
        bVar4 = true;
        goto LAB_00473681;
      }
      break;
    }
    if ((nTimeOut != 0) && (aVar10 = Abc_Clock(), local_58 < aVar10)) {
      if (fSilent == 0) {
        printf("Reached timeout (%d seconds).\n",(ulong)(uint)nTimeOut);
      }
      if (piFrames != (int *)0x0) {
        *piFrames = p->iFrameLast + -1;
      }
      Saig_BmcManStop(p);
      return -1;
    }
    local_5c = local_5c + 1;
  }
  if (fSilent == 0) {
    iVar6 = 1;
    if (1 < p->iFramePrev) {
      iVar6 = p->iFramePrev;
    }
    Abc_Print(iVar9,"No output failed in %d frames.  ",(ulong)(iVar6 - 1));
  }
  if (piFrames == (int *)0x0) {
    iVar6 = -1;
    bVar4 = false;
  }
  else {
    if (p->iOutputLast < 1) {
      iVar8 = p->iFramePrev + -1;
    }
    else {
      iVar8 = p->iFramePrev + -2;
    }
    iVar6 = -1;
    bVar4 = false;
LAB_00473681:
    *piFrames = iVar8;
  }
LAB_00473683:
  if (fSilent != 0) goto LAB_00473759;
  Abc_Print(iVar9,"%s =","Time");
  aVar10 = Abc_Clock();
  pcVar11 = "%9.2f sec\r";
  if (fVerbOverwrite == 0) {
    pcVar11 = "%9.2f sec\n";
  }
  Abc_Print(iVar9,pcVar11,(double)(aVar10 - local_40) / 1000000.0);
  if (bVar4) goto LAB_00473759;
  uVar12 = (ulong)(uint)p->nFramesMax;
  if (p->iFrameLast < p->nFramesMax) {
    uVar1 = p->nConfMaxAll;
    if (uVar1 != 0) {
      if (p->pSat == (sat_solver *)0x0) {
        iVar9 = satoko_conflictnum(p->pSat2);
        uVar1 = p->nConfMaxAll;
      }
      else {
        iVar9 = (int)(p->pSat->stats).conflicts;
      }
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < iVar9) {
        pcVar11 = "Reached global conflict limit (%d).\n";
        goto LAB_00473752;
      }
    }
    if ((nTimeOut == 0) || (aVar10 = Abc_Clock(), aVar10 <= local_58)) {
      uVar12 = (ulong)(uint)p->nConfMaxOne;
      pcVar11 = "Reached local conflict limit (%d).\n";
    }
    else {
      pcVar11 = "Reached timeout (%d seconds).\n";
      uVar12 = (ulong)(uint)nTimeOut;
    }
  }
  else {
    pcVar11 = "Reached limit on the number of timeframes (%d).\n";
  }
LAB_00473752:
  printf(pcVar11,uVar12);
LAB_00473759:
  Saig_BmcManStop(p);
  fflush(_stdout);
  return iVar6;
}

Assistant:

int Saig_BmcPerform( Aig_Man_t * pAig, int nStart, int nFramesMax, int nNodesMax, int nTimeOut, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fVerbOverwrite, int * piFrames, int fSilent, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Man_t * pNew;
    Cnf_Dat_t * pCnf;
    int nOutsSolved = 0;
    int Iter, RetValue = -1;
    abctime nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime clk = Abc_Clock(), clk2, clkTotal = Abc_Clock();
    int Status = -1;
/*
    Vec_Ptr_t * vSimInfo;
    vSimInfo = Abs_ManTernarySimulate( pAig, nFramesMax, fVerbose );
    Abs_ManFreeAray( vSimInfo );
*/
    if ( fVerbose )
    {
        printf( "Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n", 
            nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll );
    } 
    nFramesMax = nFramesMax ? nFramesMax : ABC_INFINITY;
    p = Saig_BmcManStart( pAig, nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll, fVerbose, fUseSatoko );
    // set runtime limit
    if ( nTimeOut )
    {
        if ( p->pSat2 )
            satoko_set_runtime_limit( p->pSat2, nTimeToStop );
        else
            sat_solver_set_runtime_limit( p->pSat, nTimeToStop );
    }
    for ( Iter = 0; ; Iter++ )
    {
        clk2 = Abc_Clock();
        // add new logic interval to frames
        Saig_BmcInterval( p );
//        Saig_BmcAddTargetsAsPos( p );
        if ( Vec_PtrSize(p->vTargets) == 0 )
            break;
        // convert logic slice into new AIG
        pNew = Saig_BmcIntervalToAig( p );
//printf( "StitchVars = %d.\n", p->nStitchVars );
        // derive CNF for the new AIG
        pCnf = Cnf_Derive( pNew, Aig_ManCoNum(pNew) );
        Cnf_DataLift( pCnf, p->nSatVars );
        p->nSatVars += pCnf->nVars;
        // add this CNF to the solver
        Saig_BmcLoadCnf( p, pCnf );
        Cnf_DataFree( pCnf );
        Aig_ManStop( pNew );
        // solve the targets
        RetValue = Saig_BmcSolveTargets( p, nStart, &nOutsSolved );
        if ( fVerbose )
        {
            printf( "%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ", 
                Iter, p->iFrameLast, p->iOutputLast, Aig_ManNodeNum(p->pFrm), p->nSatVars, 
                p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2) );   
            printf( "%4.0f MB",     4.0*(p->iFrameLast+1)*p->nObjs/(1<<20) );
            printf( "%9.2f sec", (float)(Abc_Clock() - clkTotal)/(float)(CLOCKS_PER_SEC) );
            printf( "\n" );
            fflush( stdout );
        }
        if ( RetValue != l_False )
            break;
        // check the timeout
        if ( nTimeOut && Abc_Clock() > nTimeToStop )
        {
            if ( !fSilent )
                printf( "Reached timeout (%d seconds).\n",  nTimeOut );
            if ( piFrames )
                *piFrames = p->iFrameLast-1;
            Saig_BmcManStop( p );
            return Status;
        }
    }
    if ( RetValue == l_True )
    {
        assert( p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved );
        if ( !fSilent )
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", 
                p->iOutputFail, p->pAig->pName, p->iFrameFail );
        Status = 0;
        if ( piFrames )
            *piFrames = p->iFrameFail - 1;
    }
    else // if ( RetValue == l_False || RetValue == l_Undef )
    {
        if ( !fSilent )
            Abc_Print( 1, "No output failed in %d frames.  ", Abc_MaxInt(p->iFramePrev-1, 0) );
        if ( piFrames )
        {
            if ( p->iOutputLast > 0 )
                *piFrames = p->iFramePrev - 2;
            else
                *piFrames = p->iFramePrev - 1;
        }
    }
    if ( !fSilent )
    {
        if ( fVerbOverwrite )
        {
            ABC_PRTr( "Time", Abc_Clock() - clk );
        }
        else
        {
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( RetValue != l_True )
        {
            if ( p->iFrameLast >= p->nFramesMax )
                printf( "Reached limit on the number of timeframes (%d).\n", p->nFramesMax );
            else if ( p->nConfMaxAll && (p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2)) > p->nConfMaxAll )
                printf( "Reached global conflict limit (%d).\n", p->nConfMaxAll );
            else if ( nTimeOut && Abc_Clock() > nTimeToStop )
                printf( "Reached timeout (%d seconds).\n", nTimeOut );
            else
                printf( "Reached local conflict limit (%d).\n", p->nConfMaxOne );
        }
    }
    Saig_BmcManStop( p );
    fflush( stdout );
    return Status;
}